

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_lib.cpp
# Opt level: O2

int registerTypeName(lua_State *L)

{
  bool bVar1;
  char *pcVar2;
  EmmyFacade *this;
  int iVar3;
  allocator local_61;
  string err;
  string local_40;
  
  iVar3 = 1;
  (*luaL_checklstring)(L,1,(size_t *)0x0);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  pcVar2 = (*lua_tolstring)(L,1,(size_t *)0x0);
  this = EmmyFacade::Get();
  std::__cxx11::string::string((string *)&local_40,pcVar2,&local_61);
  bVar1 = EmmyFacade::RegisterTypeName(this,L,&local_40,&err);
  std::__cxx11::string::~string((string *)&local_40);
  (*lua_pushboolean)(L,SUB14(bVar1,0));
  if (!bVar1) {
    (*lua_pushstring)(L,err._M_dataplus._M_p);
    iVar3 = 2;
  }
  std::__cxx11::string::~string((string *)&err);
  return iVar3;
}

Assistant:

int registerTypeName(lua_State* L)
{
	luaL_checkstring(L, 1);
	std::string err;
	const auto typeName = lua_tostring(L, 1);
	const auto suc = EmmyFacade::Get().RegisterTypeName(L, typeName, err);
	lua_pushboolean(L, suc);
	if (suc) return 1;
	lua_pushstring(L, err.c_str());
	return 2;
}